

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

JSValue js_std_file_getline(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  undefined1 auVar1 [16];
  int iVar2;
  FILE *__stream;
  JSRuntime *opaque;
  ulong uVar3;
  JSValue JVar4;
  JSValue JVar5;
  DynBuf dbuf;
  DynBuf local_48;
  
  __stream = (FILE *)js_std_file_get(ctx,this_val);
  if (__stream == (FILE *)0x0) {
    uVar3 = 6;
LAB_00110d75:
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar3;
    JVar4 = (JSValue)(auVar1 << 0x40);
    uVar3 = 0;
  }
  else {
    opaque = JS_GetRuntime(ctx);
    dbuf_init2(&local_48,opaque,js_realloc_rt);
    do {
      iVar2 = fgetc(__stream);
      if (iVar2 == 10) {
LAB_00110d84:
        JVar4 = JS_NewStringLen(ctx,(char *)local_48.buf,local_48.size);
        dbuf_free(&local_48);
        uVar3 = (ulong)JVar4.u.ptr & 0xffffffff00000000;
        goto LAB_00110db1;
      }
      if (iVar2 == -1) {
        if (local_48.size != 0) goto LAB_00110d84;
        dbuf_free(&local_48);
        uVar3 = 2;
        goto LAB_00110d75;
      }
      iVar2 = dbuf_putc(&local_48,(uint8_t)iVar2);
    } while (iVar2 == 0);
    dbuf_free(&local_48);
    JVar4 = JS_ThrowOutOfMemory(ctx);
    uVar3 = (ulong)JVar4.u.ptr & 0xffffffff00000000;
  }
LAB_00110db1:
  JVar5.u.ptr = (void *)((ulong)JVar4.u.ptr & 0xffffffff | uVar3);
  JVar5.tag = JVar4.tag;
  return JVar5;
}

Assistant:

static JSValue js_std_file_getline(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv)
{
    FILE *f = js_std_file_get(ctx, this_val);
    int c;
    DynBuf dbuf;
    JSValue obj;
    
    if (!f)
        return JS_EXCEPTION;

    js_std_dbuf_init(ctx, &dbuf);
    for(;;) {
        c = fgetc(f);
        if (c == EOF) {
            if (dbuf.size == 0) {
                /* EOF */
                dbuf_free(&dbuf);
                return JS_NULL;
            } else {
                break;
            }
        }
        if (c == '\n')
            break;
        if (dbuf_putc(&dbuf, c)) {
            dbuf_free(&dbuf);
            return JS_ThrowOutOfMemory(ctx);
        }
    }
    obj = JS_NewStringLen(ctx, (const char *)dbuf.buf, dbuf.size);
    dbuf_free(&dbuf);
    return obj;
}